

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimInfo.cpp
# Opt level: O1

AtomTypeSet * __thiscall
OpenMD::SimInfo::getSimulatedAtomTypes(AtomTypeSet *__return_storage_ptr__,SimInfo *this)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  int iVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  int iVar7;
  long lVar8;
  _Base_ptr p_Var9;
  pointer __v;
  int nproc;
  int count_local;
  vector<int,_std::allocator<int>_> foundTypes;
  vector<int,_std::allocator<int>_> ftGlobal;
  vector<int,_std::allocator<int>_> disps;
  vector<int,_std::allocator<int>_> counts;
  AtomType *local_68;
  set<int,_std::less<int>,_std::allocator<int>_> foundIdents;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var9 = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var5 = (this->molecules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(this->molecules_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var5 != p_Var2) {
    p_Var9 = p_Var5[1]._M_parent;
  }
  if (p_Var9 != (_Base_ptr)0x0) {
    do {
      p_Var6 = p_Var9->_M_left;
      if (p_Var6 == p_Var9->_M_right) {
        p_Var4 = (_Base_ptr)0x0;
      }
      else {
        p_Var4 = *(_Base_ptr *)p_Var6;
      }
      while (p_Var4 != (_Base_ptr)0x0) {
        p_Var6 = (_Base_ptr)&p_Var6->_M_parent;
        foundIdents._M_t._M_impl._0_8_ = p_Var4[3]._M_right;
        std::
        _Rb_tree<OpenMD::AtomType*,OpenMD::AtomType*,std::_Identity<OpenMD::AtomType*>,OpenMD::AtomTypeCompare,std::allocator<OpenMD::AtomType*>>
        ::_M_insert_unique<OpenMD::AtomType*>
                  ((_Rb_tree<OpenMD::AtomType*,OpenMD::AtomType*,std::_Identity<OpenMD::AtomType*>,OpenMD::AtomTypeCompare,std::allocator<OpenMD::AtomType*>>
                    *)__return_storage_ptr__,(AtomType **)&foundIdents);
        if (p_Var6 == p_Var9->_M_right) {
          p_Var4 = (_Base_ptr)0x0;
        }
        else {
          p_Var4 = *(_Base_ptr *)p_Var6;
        }
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      if ((_Rb_tree_header *)p_Var5 == p_Var2) {
        p_Var9 = (_Base_ptr)0x0;
      }
      else {
        p_Var9 = p_Var5[1]._M_parent;
      }
    } while (p_Var9 != (_Base_ptr)0x0);
  }
  foundTypes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  foundTypes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  foundTypes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  p_Var5 = (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var5 != p_Var1) {
    do {
      iVar3 = AtomType::getIdent(*(AtomType **)(p_Var5 + 1));
      foundIdents._M_t._M_impl._0_4_ = iVar3;
      if (foundTypes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          foundTypes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&foundTypes,
                   (iterator)
                   foundTypes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)&foundIdents);
      }
      else {
        *foundTypes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = iVar3;
        foundTypes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = foundTypes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var1);
  }
  count_local = (int)((ulong)((long)foundTypes.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                    .super__Vector_impl_data._M_finish -
                             (long)foundTypes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start) >> 2);
  MPI_Comm_size(&ompi_mpi_comm_world,&nproc);
  foundIdents._M_t._M_impl._0_8_ = foundIdents._M_t._M_impl._0_8_ & 0xffffffff00000000;
  std::vector<int,_std::allocator<int>_>::vector
            (&counts,(long)nproc,(value_type_conflict2 *)&foundIdents,(allocator_type *)&disps);
  foundIdents._M_t._M_impl._0_8_ = foundIdents._M_t._M_impl._0_8_ & 0xffffffff00000000;
  std::vector<int,_std::allocator<int>_>::vector
            (&disps,(long)nproc,(value_type_conflict2 *)&foundIdents,(allocator_type *)&ftGlobal);
  MPI_Allgather(&count_local,1,&ompi_mpi_int,
                counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_start,1,&ompi_mpi_int,&ompi_mpi_comm_world);
  *disps.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start = 0;
  iVar3 = *counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (1 < nproc) {
    iVar7 = *disps.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    lVar8 = 1;
    do {
      iVar7 = iVar7 + counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar8 + -1];
      disps.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [lVar8] = iVar7;
      iVar3 = iVar3 + counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 < nproc);
  }
  std::vector<int,_std::allocator<int>_>::vector
            (&ftGlobal,(long)iVar3,(allocator_type *)&foundIdents);
  MPI_Allgatherv(foundTypes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,count_local,&ompi_mpi_int,
                 ftGlobal.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 disps.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                 ._M_start,&ompi_mpi_int,&ompi_mpi_comm_world);
  p_Var1 = &foundIdents._M_t._M_impl.super__Rb_tree_header;
  foundIdents._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  foundIdents._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  foundIdents._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  foundIdents._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  foundIdents._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  if (ftGlobal.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      ftGlobal.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    __v = ftGlobal.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start;
    do {
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &foundIdents,__v);
      __v = __v + 1;
    } while (__v != ftGlobal.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  }
  if ((_Rb_tree_header *)foundIdents._M_t._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1)
  {
    p_Var5 = foundIdents._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_68 = ForceField::getAtomType(this->forceField_,p_Var5[1]._M_color);
      std::
      _Rb_tree<OpenMD::AtomType*,OpenMD::AtomType*,std::_Identity<OpenMD::AtomType*>,OpenMD::AtomTypeCompare,std::allocator<OpenMD::AtomType*>>
      ::_M_insert_unique<OpenMD::AtomType*>
                ((_Rb_tree<OpenMD::AtomType*,OpenMD::AtomType*,std::_Identity<OpenMD::AtomType*>,OpenMD::AtomTypeCompare,std::allocator<OpenMD::AtomType*>>
                  *)__return_storage_ptr__,&local_68);
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var1);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&foundIdents._M_t);
  if (ftGlobal.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(ftGlobal.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)ftGlobal.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)ftGlobal.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (disps.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(disps.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)disps.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)disps.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (foundTypes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(foundTypes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)foundTypes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)foundTypes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

AtomTypeSet SimInfo::getSimulatedAtomTypes() {
    SimInfo::MoleculeIterator mi;
    Molecule* mol;
    Molecule::AtomIterator ai;
    Atom* atom;
    AtomTypeSet atomTypes;

    for (mol = beginMolecule(mi); mol != NULL; mol = nextMolecule(mi)) {
      for (atom = mol->beginAtom(ai); atom != NULL; atom = mol->nextAtom(ai)) {
        atomTypes.insert(atom->getAtomType());
      }
    }

#ifdef IS_MPI

    // loop over the found atom types on this processor, and add their
    // numerical idents to a vector:

    vector<int> foundTypes;
    AtomTypeSet::iterator i;
    for (i = atomTypes.begin(); i != atomTypes.end(); ++i)
      foundTypes.push_back((*i)->getIdent());

    // count_local holds the number of found types on this processor
    int count_local = foundTypes.size();

    int nproc;
    MPI_Comm_size(MPI_COMM_WORLD, &nproc);

    // we need arrays to hold the counts and displacement vectors for
    // all processors
    vector<int> counts(nproc, 0);
    vector<int> disps(nproc, 0);

    // fill the counts array
    MPI_Allgather(&count_local, 1, MPI_INT, &counts[0], 1, MPI_INT,
                  MPI_COMM_WORLD);

    // use the processor counts to compute the displacement array
    disps[0]       = 0;
    int totalCount = counts[0];
    for (int iproc = 1; iproc < nproc; iproc++) {
      disps[iproc] = disps[iproc - 1] + counts[iproc - 1];
      totalCount += counts[iproc];
    }

    // we need a (possibly redundant) set of all found types:
    vector<int> ftGlobal(totalCount);

    // now spray out the foundTypes to all the other processors:
    MPI_Allgatherv(&foundTypes[0], count_local, MPI_INT, &ftGlobal[0],
                   &counts[0], &disps[0], MPI_INT, MPI_COMM_WORLD);

    vector<int>::iterator j;

    // foundIdents is a stl set, so inserting an already found ident
    // will have no effect.
    set<int> foundIdents;

    for (j = ftGlobal.begin(); j != ftGlobal.end(); ++j)
      foundIdents.insert((*j));

    // now iterate over the foundIdents and get the actual atom types
    // that correspond to these:
    set<int>::iterator it;
    for (it = foundIdents.begin(); it != foundIdents.end(); ++it)
      atomTypes.insert(forceField_->getAtomType((*it)));

#endif

    return atomTypes;
  }